

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  double dVar3;
  double dVar4;
  double metropolis;
  double action_fin;
  double dx;
  double action_init;
  double backup_x;
  int iter;
  int naccept;
  double x;
  double step_size;
  int niter;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  _iter = 0.0;
  backup_x._4_4_ = 0;
  for (backup_x._0_4_ = 1; backup_x._0_4_ < 0x65; backup_x._0_4_ = backup_x._0_4_ + 1) {
    iVar1 = rand();
    dVar3 = ((double)iVar1 / 2147483647.0 - 0.5) * 0.5 * 2.0 + _iter;
    iVar1 = rand();
    dVar4 = exp(_iter * 0.5 * _iter - dVar3 * 0.5 * dVar3);
    if ((double)iVar1 / 2147483647.0 < dVar4) {
      backup_x._4_4_ = backup_x._4_4_ + 1;
      _iter = dVar3;
    }
    printf("%.10f\t%f\n",_iter,(double)backup_x._4_4_ / (double)backup_x._0_4_);
  }
  return 0;
}

Assistant:

int main(void) {
    int niter = 100; // サンプルの数
    double step_size = 0.5e0;
    srand((unsigned) time(nullptr));

    double x = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double action_init = 0.5e0 * x * x;

        double dx = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size * 2e0;
        x += dx;

        double action_fin = 0.5e0 * x * x;

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
        }
        printf("%.10f\t%f\n", x, (double) naccept / iter);
    }
}